

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Descriptor.cpp
# Opt level: O1

TypeDescriptor * addOperator(TypeDescriptor *leftValue,TypeDescriptor *rightValue)

{
  size_type *psVar1;
  pointer pcVar2;
  StringDescriptor *this;
  undefined8 *puVar3;
  NumberDescriptor *this_00;
  ulong uVar4;
  string local_80;
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  ulong *local_40;
  long local_38;
  ulong local_30 [2];
  
  if (leftValue->_type == NUMBER) {
    this_00 = (NumberDescriptor *)operator_new(0x60);
    NumberDescriptor::NumberDescriptor(this_00,leftValue->_number + rightValue->_number);
    return &this_00->super_TypeDescriptor;
  }
  this = (StringDescriptor *)operator_new(0x78);
  pcVar2 = (leftValue->_string)._M_dataplus._M_p;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + (leftValue->_string)._M_string_length);
  pcVar2 = (rightValue->_string)._M_dataplus._M_p;
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + (rightValue->_string)._M_string_length);
  uVar4 = 0xf;
  if (local_40 != local_30) {
    uVar4 = local_30[0];
  }
  if (uVar4 < (ulong)(local_58 + local_38)) {
    uVar4 = 0xf;
    if (local_60 != local_50) {
      uVar4 = local_50[0];
    }
    if ((ulong)(local_58 + local_38) <= uVar4) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_40);
      goto LAB_00114417;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_40,(ulong)local_60);
LAB_00114417:
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  psVar1 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_80.field_2._M_allocated_capacity = *psVar1;
    local_80.field_2._8_8_ = puVar3[3];
  }
  else {
    local_80.field_2._M_allocated_capacity = *psVar1;
    local_80._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_80._M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  StringDescriptor::StringDescriptor(this,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return &this->super_TypeDescriptor;
}

Assistant:

TypeDescriptor *addOperator(TypeDescriptor *leftValue, TypeDescriptor *rightValue){
    if(leftValue->type() == TypeDescriptor::NUMBER){
        auto *numSum = new  NumberDescriptor(leftValue->getNumber() + rightValue->getNumber());
        //std::cout << "TypeDescriptor* addOperator: " << leftValue->getNumber() << " + " << rightValue->getNumber() << std::endl;
        return numSum;
    }else if(leftValue->STRING){

        auto *stringSum = new StringDescriptor( leftValue->getString()  + rightValue->getString() );
        return stringSum;
    }else{
        std::cout << "Unknown type. Terminating" << std::endl;
        exit(2);
    }
}